

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O2

Tail njoy::ENDFtk::record::skip<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *end,long *lineNumber)

{
  array<int,_3UL> local_50;
  Base<njoy::ENDFtk::record::Character<66>> local_40 [32];
  
  Base<njoy::ENDFtk::record::Character<66>>::
  Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(local_40,begin,end);
  std::__cxx11::string::~string((string *)local_40);
  Tail::Tail<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((Tail *)&local_50,begin,end,lineNumber);
  return (array<int,_3UL>)(array<int,_3UL>)local_50._M_elems;
}

Assistant:

Tail skip( Iterator& begin, const Iterator& end, long& lineNumber ){
    try{
      Base< Character< 66 > >( begin, end );
    } catch( std::exception& e ){
      Log::info( "Error while skipping a record." );
      throw e;
    }
    return Tail( begin, end, lineNumber );
  }